

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall
absl::synchronization_internal::ThreadPool::ThreadPool(ThreadPool *this,int num_threads)

{
  value_type *__x;
  int in_ESI;
  long in_RDI;
  vector<std::thread,_std::allocator<std::thread>_> *this_00;
  int i;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *in_stack_ffffffffffffffa0;
  type *in_stack_ffffffffffffffd8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe4;
  
  Mutex::Mutex((Mutex *)0x186514);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (in_stack_ffffffffffffffa0);
  this_00 = (vector<std::thread,_std::allocator<std::thread>_> *)(in_RDI + 0x58);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x18653c);
  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
    __x = (value_type *)(in_RDI + 0x58);
    std::thread::
    thread<void(absl::synchronization_internal::ThreadPool::*)(),absl::synchronization_internal::ThreadPool*,void>
              ((thread *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),in_stack_ffffffffffffffd8,
               (ThreadPool **)0x0);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back(this_00,__x);
    std::thread::~thread((thread *)0x1865ac);
  }
  return;
}

Assistant:

explicit ThreadPool(int num_threads) {
    for (int i = 0; i < num_threads; ++i) {
      threads_.push_back(std::thread(&ThreadPool::WorkLoop, this));
    }
  }